

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

optional<operator_token> read_operator(string_view buf_1,string_view buf_2)

{
  bool bVar1;
  _Storage<operator_token,_true> _Var2;
  undefined4 uVar3;
  undefined8 unaff_RBP;
  undefined7 uVar4;
  _Storage<operator_token,_true> _Var5;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  optional<operator_token> oVar6;
  
  _Var5 = (_Storage<operator_token,_true>)buf_1._M_str;
  __y._M_str = "<";
  __y._M_len = 1;
  bVar1 = std::operator==(buf_1,__y);
  uVar4 = (undefined7)((ulong)unaff_RBP >> 8);
  if (bVar1) {
    __y_00._M_str = "=";
    __y_00._M_len = 1;
    bVar1 = std::operator==(buf_2,__y_00);
    _Var2 = (_Storage<operator_token,_true>)0x100000002;
    _Var5 = (_Storage<operator_token,_true>)0x200000002;
  }
  else {
    __y_01._M_str = ">";
    __y_01._M_len = 1;
    bVar1 = std::operator==(buf_1,__y_01);
    if (!bVar1) {
      __y_03._M_str = "=";
      __y_03._M_len = 1;
      bVar1 = std::operator==(buf_1,__y_03);
      if (bVar1) {
        _Var5 = (_Storage<operator_token,_true>)0x200000001;
        __y_04._M_str = "<";
        __y_04._M_len = 1;
        bVar1 = std::operator==(buf_2,__y_04);
        uVar3 = (undefined4)CONCAT71(uVar4,1);
        if (bVar1) {
          _Var5 = (_Storage<operator_token,_true>)0x200000002;
        }
        else {
          __y_05._M_str = "=";
          __y_05._M_len = 1;
          bVar1 = std::operator==(buf_2,__y_05);
          if (bVar1) {
            _Var5 = (_Storage<operator_token,_true>)0x200000000;
          }
          else {
            __y_06._M_str = ">";
            __y_06._M_len = 1;
            bVar1 = std::operator==(buf_2,__y_06);
            if (!bVar1) {
              _Var5 = (_Storage<operator_token,_true>)0x100000000;
            }
          }
        }
      }
      else {
        uVar3 = 0;
      }
      goto LAB_0011c000;
    }
    __y_02._M_str = "=";
    __y_02._M_len = 1;
    bVar1 = std::operator==(buf_2,__y_02);
    _Var5 = (_Storage<operator_token,_true>)0x200000001;
    _Var2 = (_Storage<operator_token,_true>)0x100000001;
  }
  if (bVar1 == false) {
    _Var5 = _Var2;
  }
  uVar3 = (undefined4)CONCAT71(uVar4,1);
LAB_0011c000:
  oVar6.super__Optional_base<operator_token,_true,_true>._M_payload.
  super__Optional_payload_base<operator_token>._8_4_ = uVar3;
  oVar6.super__Optional_base<operator_token,_true,_true>._M_payload.
  super__Optional_payload_base<operator_token>._M_payload = _Var5;
  return (optional<operator_token>)
         oVar6.super__Optional_base<operator_token,_true,_true>._M_payload.
         super__Optional_payload_base<operator_token>;
}

Assistant:

std::optional<operator_token>
read_operator(const std::string_view buf_1,
              const std::string_view buf_2) noexcept
{
    if (buf_1 == "<")
        return operator_token{ baryonyx::operator_type::less,
                               buf_2 == "=" ? 2 : 1 };

    if (buf_1 == ">")
        return operator_token{ baryonyx::operator_type::greater,
                               buf_2 == "=" ? 2 : 1 };

    if (buf_1 == "=") {
        if (buf_2 == "<")
            return operator_token{ baryonyx::operator_type::less, 2 };

        if (buf_2 == "=")
            return operator_token{ baryonyx::operator_type::equal, 2 };

        if (buf_2 == ">")
            return operator_token{ baryonyx::operator_type::greater, 2 };

        return operator_token{ baryonyx::operator_type::equal, 1 };
    }

    return std::nullopt;
}